

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatLut.c
# Opt level: O2

void Sbl_ManWindow(Sbl_Man_t *p)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  int iVar3;
  Gia_Man_t *pGVar4;
  
  p->vLeaves->nSize = 0;
  iVar3 = 0;
  while( true ) {
    pGVar4 = p->pGia;
    if (pGVar4->vCis->nSize <= iVar3) break;
    iVar1 = Vec_IntEntry(pGVar4->vCis,iVar3);
    pGVar2 = Gia_ManObj(pGVar4,iVar1);
    iVar1 = Gia_ObjId(pGVar4,pGVar2);
    if (iVar1 == 0) break;
    Vec_IntPush(p->vLeaves,iVar1);
    iVar3 = iVar3 + 1;
  }
  p->vAnds->nSize = 0;
  for (iVar3 = 0; pGVar4 = p->pGia, iVar3 < pGVar4->nObjs; iVar3 = iVar3 + 1) {
    pGVar2 = Gia_ManObj(pGVar4,iVar3);
    if ((~*(uint *)pGVar2 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar2) {
      Vec_IntPush(p->vAnds,iVar3);
    }
  }
  p->vRoots->nSize = 0;
  for (iVar3 = 0; iVar3 < pGVar4->vCos->nSize; iVar3 = iVar3 + 1) {
    pGVar2 = Gia_ManCo(pGVar4,iVar3);
    iVar1 = Gia_ObjFaninId0p(pGVar4,pGVar2);
    Vec_IntPush(p->vRoots,iVar1);
    pGVar4 = p->pGia;
  }
  return;
}

Assistant:

void Sbl_ManWindow( Sbl_Man_t * p )
{
    int i, ObjId;
    // collect leaves
    Vec_IntClear( p->vLeaves );
    Gia_ManForEachCiId( p->pGia, ObjId, i )
        Vec_IntPush( p->vLeaves, ObjId );
    // collect internal
    Vec_IntClear( p->vAnds );
    Gia_ManForEachAndId( p->pGia, ObjId )
        Vec_IntPush( p->vAnds, ObjId );
    // collect roots
    Vec_IntClear( p->vRoots );
    Gia_ManForEachCoDriverId( p->pGia, ObjId, i )
        Vec_IntPush( p->vRoots, ObjId );
}